

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

size_t dlbulk_free(void **array,size_t nelem)

{
  size_t sVar1;
  size_t nelem_local;
  void **array_local;
  
  sVar1 = internal_bulk_free(&_gm_,array,nelem);
  return sVar1;
}

Assistant:

size_t dlbulk_free(void* array[], size_t nelem) {
  return internal_bulk_free(gm, array, nelem);
}